

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall
cmCTestTestHandler::LogDisabledTests
          (cmCTestTestHandler *this,
          vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          *disabledTests)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  cmCTestTestResult *dt;
  pointer pcVar5;
  char *pcVar6;
  ostringstream cmCTestLog_msg;
  cmGeneratedFileStream ofs;
  string local_438;
  cmCTestTestHandler *local_418;
  undefined1 local_410 [112];
  ios_base local_3a0 [264];
  cmGeneratedFileStream local_298;
  
  if ((disabledTests->
      super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (disabledTests->
      super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_418 = this;
    cmGeneratedFileStream::cmGeneratedFileStream(&local_298,None);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
    std::ios::widen((char)(ostringstream *)local_410 +
                    (char)*(_func_int **)(local_410._0_8_ + -0x18));
    std::ostream::put((char)local_410);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"The following tests did not run:",0x20);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar1 = (local_418->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x27a,local_438._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
    std::ios_base::~ios_base((ios_base *)(local_410 + 0x70));
    cmCTestGenericHandler::StartLogFile
              (&local_418->super_cmCTestGenericHandler,"TestsDisabled",&local_298);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
    cmCTest::GetColorCode_abi_cxx11_(&local_438,(local_418->super_cmCTestGenericHandler).CTest,BLUE)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_410,local_438._M_dataplus._M_p,local_438._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (local_418->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x27f,local_438._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
    std::ios_base::~ios_base((ios_base *)(local_410 + 0x70));
    pcVar5 = (disabledTests->
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (disabledTests->
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar5 != pcVar2) {
      do {
        poVar4 = (ostream *)std::ostream::operator<<(&local_298,pcVar5->TestCount);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pcVar5->Name)._M_dataplus._M_p,(pcVar5->Name)._M_string_length);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        iVar3 = std::__cxx11::string::compare((char *)&pcVar5->CompletionStatus);
        pcVar6 = "Skipped";
        if (iVar3 == 0) {
          pcVar6 = "Disabled";
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_410,"\t",1);
        *(undefined8 *)(*(_func_int **)(local_410._0_8_ + -0x18) + (long)(local_410 + 0x10)) = 3;
        poVar4 = (ostream *)std::ostream::operator<<((ostringstream *)local_410,pcVar5->TestCount);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pcVar5->Name)._M_dataplus._M_p,(pcVar5->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,(ulong)(iVar3 == 0) + 7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pcVar1 = (local_418->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x289,local_438._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
        std::ios_base::~ios_base((ios_base *)(local_410 + 0x70));
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != pcVar2);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
    cmCTest::GetColorCode_abi_cxx11_
              (&local_438,(local_418->super_cmCTestGenericHandler).CTest,CLEAR_COLOR);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_410,local_438._M_dataplus._M_p,local_438._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (local_418->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x28c,local_438._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
    std::ios_base::~ios_base((ios_base *)(local_410 + 0x70));
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_298);
  }
  return;
}

Assistant:

void cmCTestTestHandler::LogDisabledTests(
  const std::vector<cmCTestTestResult>& disabledTests)
{
  if (!disabledTests.empty()) {
    cmGeneratedFileStream ofs;
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::endl
                 << "The following tests did not run:" << std::endl);
    this->StartLogFile("TestsDisabled", ofs);

    const char* disabled_reason;
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               this->CTest->GetColorCode(cmCTest::Color::BLUE));
    for (cmCTestTestResult const& dt : disabledTests) {
      ofs << dt.TestCount << ":" << dt.Name << std::endl;
      if (dt.CompletionStatus == "Disabled") {
        disabled_reason = "Disabled";
      } else {
        disabled_reason = "Skipped";
      }
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "\t" << std::setw(3) << dt.TestCount << " - " << dt.Name
                      << " (" << disabled_reason << ")" << std::endl);
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               this->CTest->GetColorCode(cmCTest::Color::CLEAR_COLOR));
  }
}